

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int enc_row_mt_worker_hook(void *arg1,void *unused)

{
  AV1_COMMON *cm_00;
  char cVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  AV1_COMP *cpi;
  AV1LfSync *pAVar5;
  TileDataEnc *pTVar6;
  ThreadData *td;
  FRAME_CONTEXT *__dest;
  MB_RD_RECORD *pMVar7;
  undefined8 *puVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  PC_TREE *pPVar22;
  byte bVar23;
  byte bVar24;
  ulong uVar25;
  long lVar26;
  TileDataEnc *pTVar27;
  AV1LfMTInfo *pAVar28;
  pthread_mutex_t *ppVar29;
  TileDataEnc *tile;
  int iVar30;
  int iVar31;
  bool bVar32;
  _Bool do_pipelined_lpf_mt_with_enc;
  AV1_COMMON *cm;
  AV1_COMMON *cm_1;
  
  cpi = *arg1;
  lVar20 = *(long *)((long)arg1 + 8);
  iVar18 = *(int *)((long)arg1 + 0x1cc);
  ppVar29 = (cpi->mt_info).enc_row_mt.mutex_;
  pAVar5 = *(AV1LfSync **)((long)arg1 + 0x1b8);
  *(aom_internal_error_info **)(lVar20 + 0x2b90) = (aom_internal_error_info *)((long)arg1 + 0x18);
  cm_00 = &cpi->common;
  if ((cpi->mt_info).pipeline_lpf_mt_with_enc == 0) {
    bVar32 = false;
  }
  else {
    bVar32 = true;
    if ((cpi->common).lf.filter_level[0] == 0) {
      bVar32 = (cpi->common).lf.filter_level[1] != 0;
    }
  }
  iVar13 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar13 != 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)ppVar29);
    (cpi->mt_info).enc_row_mt.row_mt_exit = true;
    pthread_cond_broadcast((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_);
    pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
    lVar20 = (long)(cpi->common).tiles.rows;
    if (0 < lVar20) {
      iVar18 = ((cpi->common).seq_params)->mib_size;
      uVar3 = (cpi->common).tiles.cols;
      lVar26 = 0;
      do {
        if (0 < (int)uVar3) {
          lVar21 = lVar26 * (ulong)uVar3;
          uVar25 = 0;
          do {
            pTVar6 = cpi->tile_data;
            iVar14 = av1_get_sb_cols_in_tile(cm_00,&pTVar6[uVar25 + lVar21].tile_info);
            iVar13 = pTVar6[uVar25 + lVar21].tile_info.mi_row_start;
            if (iVar13 < pTVar6[uVar25 + lVar21].tile_info.mi_row_end) {
              iVar30 = 0;
              do {
                iVar13 = iVar13 + iVar18;
                (*(cpi->mt_info).enc_row_mt.sync_write_ptr)
                          (&pTVar6[uVar25 + lVar21].row_mt_sync,iVar30,iVar14 + -1,iVar14);
                iVar30 = iVar30 + 1;
              } while (iVar13 < pTVar6[uVar25 + lVar21].tile_info.mi_row_end);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar3);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != lVar20);
    }
    if (bVar32) {
      pthread_mutex_lock((pthread_mutex_t *)pAVar5->job_mutex);
      pAVar5->lf_mt_exit = true;
      pthread_mutex_unlock((pthread_mutex_t *)pAVar5->job_mutex);
      av1_set_vert_loop_filter_done(cm_00,pAVar5,((cpi->common).seq_params)->mib_size_log2);
    }
    return 0;
  }
  *(undefined4 *)((long)arg1 + 0xe8) = 1;
  iVar13 = ((cpi->common).seq_params)->mib_size_log2;
  iVar18 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[iVar18];
  if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
    lVar26 = *(long *)((long)arg1 + 8);
    *(undefined8 *)(lVar26 + 0x26e50) = 0;
  }
  else {
    pPVar22 = av1_alloc_pc_tree_node(((cpi->common).seq_params)->sb_size);
    lVar26 = *(long *)((long)arg1 + 8);
    *(PC_TREE **)(lVar26 + 0x26e50) = pPVar22;
    if (pPVar22 == (PC_TREE *)0x0) {
      aom_internal_error(*(aom_internal_error_info **)(lVar20 + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
      lVar26 = *(long *)((long)arg1 + 8);
    }
  }
  *(FRAME_CONTEXT **)(lVar26 + 0x2b38) = (cpi->common).fc;
  pthread_mutex_lock((pthread_mutex_t *)ppVar29);
  cVar1 = (cpi->mt_info).enc_row_mt.row_mt_exit;
  while( true ) {
    if (cVar1 != '\0') {
      pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
      *(undefined4 *)((long)arg1 + 0xe8) = 0;
      return 1;
    }
    pTVar6 = cpi->tile_data;
    lVar20 = (long)iVar18;
    iVar14 = pTVar6[lVar20].row_mt_sync.next_mi_row;
    bVar23 = (byte)iVar13;
    if (pTVar6[lVar20].tile_info.mi_row_end <= iVar14) break;
LAB_001ce537:
    iVar30 = ((cpi->common).seq_params)->mib_size;
    piVar9 = &pTVar6[lVar20].row_mt_sync.num_threads_working;
    *piVar9 = *piVar9 + 1;
    pTVar6[lVar20].row_mt_sync.next_mi_row = iVar30 + iVar14;
LAB_001ce564:
    pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
    pTVar27 = cpi->tile_data;
    pTVar6 = pTVar27 + lVar20;
    iVar30 = pTVar27[lVar20].tile_info.tile_row;
    iVar19 = pTVar27[lVar20].tile_info.tile_col;
    td = *(ThreadData **)((long)arg1 + 8);
    __dest = td->tctx;
    (td->mb).e_mbd.tile_ctx = __dest;
    (td->mb).tile_pb_ctx = &pTVar27[lVar20].tctx;
    td->abs_sum_level = 0;
    if ((pTVar27[lVar20].allow_update_cdf == '\0') ||
       ((td->mb).row_ctx = pTVar6->row_ctx, iVar14 == (pTVar6->tile_info).mi_row_start)) {
      memcpy(__dest,&pTVar27[lVar20].tctx,0x52fc);
    }
    uVar2 = ((cpi->common).seq_params)->monochrome;
    lVar20 = 0;
    do {
      (td->mb).e_mbd.above_entropy_context[lVar20] =
           (cpi->common).above_contexts.entropy[lVar20][iVar30];
      lVar20 = lVar20 + 1;
    } while ((ulong)(uVar2 == '\0') * 2 + 1 != lVar20);
    (td->mb).e_mbd.above_partition_context = (cpi->common).above_contexts.partition[iVar30];
    (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[iVar30];
    cfl_init(&(td->mb).e_mbd.cfl,(cpi->common).seq_params);
    pMVar7 = (td->mb).txfm_search_info.mb_rd_record;
    if (pMVar7 != (MB_RD_RECORD *)0x0) {
      av1_crc32c_calculator_init(&pMVar7->crc_calculator);
    }
    av1_encode_sb_row(cpi,td,iVar30,iVar19,iVar14);
    pthread_mutex_lock((pthread_mutex_t *)ppVar29);
    pTVar6->abs_sum_level = pTVar6->abs_sum_level + td->abs_sum_level;
    piVar9 = &(pTVar6->row_mt_sync).num_threads_working;
    *piVar9 = *piVar9 + -1;
    piVar9 = (cpi->mt_info).enc_row_mt.num_tile_cols_done + (iVar14 >> (bVar23 & 0x1f));
    *piVar9 = *piVar9 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_);
    pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
    pthread_mutex_lock((pthread_mutex_t *)ppVar29);
    cVar1 = (cpi->mt_info).enc_row_mt.row_mt_exit;
  }
  lVar20 = (long)(cpi->common).tiles.rows;
  if (0 < lVar20) {
    uVar3 = (cpi->common).tiles.cols;
    iVar14 = 0x7fffffff;
    iVar18 = -1;
    iVar30 = 0;
    lVar26 = 0;
    iVar19 = 0;
    pTVar27 = pTVar6;
    do {
      uVar25 = (ulong)uVar3;
      tile = pTVar27;
      iVar31 = iVar30;
      if (0 < (int)uVar3) {
        do {
          iVar15 = av1_get_sb_rows_in_tile(cm_00,&tile->tile_info);
          iVar16 = av1_get_sb_cols_in_tile(cm_00,&tile->tile_info);
          iVar16 = iVar16 + 1 >> 1;
          if (iVar15 <= iVar16) {
            iVar16 = iVar15;
          }
          iVar15 = (tile->row_mt_sync).num_threads_working;
          iVar11 = iVar19;
          iVar12 = iVar18;
          if ((iVar15 < iVar16) &&
             (iVar16 = (tile->tile_info).mi_row_end, iVar4 = (tile->row_mt_sync).next_mi_row,
             iVar17 = iVar16 - iVar4, iVar17 != 0 && iVar4 <= iVar16)) {
            iVar16 = iVar14;
            if (iVar15 < iVar14) {
              iVar19 = 0;
              iVar16 = iVar15;
            }
            bVar10 = iVar14 < iVar15;
            iVar14 = iVar16;
            iVar11 = iVar17;
            iVar12 = iVar31;
            if (bVar10 || iVar17 <= iVar19) {
              iVar11 = iVar19;
              iVar12 = iVar18;
            }
          }
          iVar18 = iVar12;
          iVar19 = iVar11;
          iVar31 = iVar31 + 1;
          tile = tile + 1;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      lVar26 = lVar26 + 1;
      iVar30 = iVar30 + uVar3;
      pTVar27 = pTVar27 + uVar3;
    } while (lVar26 != lVar20);
    if (iVar18 != -1) {
      lVar20 = (long)iVar18;
      iVar14 = pTVar6[lVar20].row_mt_sync.next_mi_row;
      if (iVar14 < pTVar6[lVar20].tile_info.mi_row_end) goto LAB_001ce537;
      iVar14 = -1;
      goto LAB_001ce564;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
  if (bVar32) {
    pAVar5 = *(AV1LfSync **)((long)arg1 + 0x1b8);
    iVar18 = (cpi->common).mi_params.mi_rows;
    iVar14 = ((cpi->common).seq_params)->mib_size_log2;
    ppVar29 = (cpi->mt_info).enc_row_mt.mutex_;
    pthread_mutex_lock((pthread_mutex_t *)pAVar5->job_mutex);
    if (pAVar5->lf_mt_exit == false) {
      bVar24 = (byte)iVar14;
      iVar18 = ((1 << (bVar24 & 0x1f)) + iVar18 + -1 >> (bVar24 & 0x1f)) + -1;
      do {
        iVar14 = pAVar5->jobs_dequeued;
        if (pAVar5->jobs_enqueued <= iVar14) break;
        pAVar28 = pAVar5->job_queue;
        pAVar5->jobs_dequeued = iVar14 + 1;
        pthread_mutex_unlock((pthread_mutex_t *)pAVar5->job_mutex);
        if (pAVar28 == (AV1LfMTInfo *)0x0) goto LAB_001ce8f6;
        pAVar28 = pAVar28 + iVar14;
        puVar8 = *(undefined8 **)((long)arg1 + 0x1c0);
        iVar14 = pAVar28->mi_row;
        iVar30 = pAVar28->lpf_opt_level;
        pthread_mutex_lock((pthread_mutex_t *)ppVar29);
        if ((cpi->mt_info).enc_row_mt.row_mt_exit != false) goto LAB_001ce8f1;
        iVar14 = iVar14 >> (bVar23 & 0x1f);
        iVar19 = iVar14 + 1;
        if (iVar18 < iVar19) {
          iVar19 = iVar18;
        }
        while( true ) {
          piVar9 = (cpi->mt_info).enc_row_mt.num_tile_cols_done;
          iVar31 = (cpi->common).tiles.cols;
          if ((iVar31 <= piVar9[iVar14]) && (iVar31 <= piVar9[iVar19])) break;
          pthread_cond_wait((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_,
                            (pthread_mutex_t *)ppVar29);
          if ((cpi->mt_info).enc_row_mt.row_mt_exit != false) goto LAB_001ce8f1;
        }
        pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
        av1_thread_loop_filter_rows
                  ((YV12_BUFFER_CONFIG *)*puVar8,(AV1_COMMON *)puVar8[1],
                   (macroblockd_plane *)(puVar8 + 2),(MACROBLOCKD *)puVar8[0x3d4],pAVar28->mi_row,
                   pAVar28->plane,pAVar28->dir,iVar30,pAVar5,
                   (aom_internal_error_info *)((long)arg1 + 0x18),
                   (AV1_DEBLOCKING_PARAMETERS *)(puVar8 + 0x3d5),(TX_SIZE *)(puVar8 + 0x415),iVar13)
        ;
        pthread_mutex_lock((pthread_mutex_t *)pAVar5->job_mutex);
      } while (pAVar5->lf_mt_exit == false);
    }
    ppVar29 = pAVar5->job_mutex;
LAB_001ce8f1:
    pthread_mutex_unlock((pthread_mutex_t *)ppVar29);
  }
LAB_001ce8f6:
  av1_free_pc_tree_recursive
            (*(PC_TREE **)(*(long *)((long)arg1 + 8) + 0x26e50),
             (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,0,0,
             (cpi->sf).part_sf.partition_search_type);
  *(undefined8 *)(*(long *)((long)arg1 + 8) + 0x26e50) = 0;
  *(undefined4 *)((long)arg1 + 0xe8) = 0;
  return 1;
}

Assistant:

static int enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  AV1LfSync *const lf_sync = thread_data->lf_sync;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;
  AV1_COMMON *volatile const cm = &cpi->common;
  volatile const bool do_pipelined_lpf_mt_with_enc = lpf_mt_with_enc_enabled(
      cpi->mt_info.pipeline_lpf_mt_with_enc, cm->lf.filter_level);

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->row_mt_exit = true;
    // Wake up all the workers waiting in launch_loop_filter_rows() to exit in
    // case of an error.
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_encoding_done(cpi);

    if (do_pipelined_lpf_mt_with_enc) {
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(lf_sync->job_mutex);
      lf_sync->lf_mt_exit = true;
      pthread_mutex_unlock(lf_sync->job_mutex);
#endif
      av1_set_vert_loop_filter_done(&cpi->common, lf_sync,
                                    cpi->common.seq_params->mib_size_log2);
    }
    return 0;
  }
  error_info->setjmp = 1;

  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];

  // Preallocate the pc_tree for realtime coding to reduce the cost of memory
  // allocation.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode) {
    thread_data->td->pc_root = av1_alloc_pc_tree_node(cm->seq_params->sb_size);
    if (!thread_data->td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
  } else {
    thread_data->td->pc_root = NULL;
  }

  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  int end_of_frame = 0;
  bool row_mt_exit = false;

  // When master thread does not have a valid job to process, xd->tile_ctx
  // is not set and it contains NULL pointer. This can result in NULL pointer
  // access violation if accessed beyond the encode stage. Hence, updating
  // thread_data->td->mb.e_mbd.tile_ctx is initialized with common frame
  // context to avoid NULL pointer access in subsequent stages.
  thread_data->td->mb.e_mbd.tile_ctx = cm->fc;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_exit = enc_row_mt->row_mt_exit;
    // row_mt_exit check here can be avoided as it is checked after
    // sync_read_ptr() in encode_sb_row(). However, checking row_mt_exit here,
    // tries to return before calling the function get_next_job().
    if (!row_mt_exit &&
        !get_next_job(&cpi->tile_data[cur_tile_id], &current_mi_row,
                      cm->seq_params->mib_size)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 0,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When row_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (row_mt_exit) {
      error_info->setjmp = 0;
      return 1;
    }

    if (end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    const TileInfo *const tile_info = &this_tile->tile_info;
    const int tile_row = tile_info->tile_row;
    const int tile_col = tile_info->tile_col;
    ThreadData *td = thread_data->td;
    const int sb_row = current_mi_row >> mib_size_log2;

    assert(current_mi_row != -1 && current_mi_row <= tile_info->mi_row_end);

    td->mb.e_mbd.tile_ctx = td->tctx;
    td->mb.tile_pb_ctx = &this_tile->tctx;
    td->abs_sum_level = 0;

    if (this_tile->allow_update_cdf) {
      td->mb.row_ctx = this_tile->row_ctx;
      if (current_mi_row == tile_info->mi_row_start)
        memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    } else {
      memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    }

    av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row,
                           &td->mb.e_mbd);
#if !CONFIG_REALTIME_ONLY
    cfl_init(&td->mb.e_mbd.cfl, cm->seq_params);
#endif
    if (td->mb.txfm_search_info.mb_rd_record != NULL) {
      av1_crc32c_calculator_init(
          &td->mb.txfm_search_info.mb_rd_record->crc_calculator);
    }

    av1_encode_sb_row(cpi, td, tile_row, tile_col, current_mi_row);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    this_tile->abs_sum_level += td->abs_sum_level;
    row_mt_sync->num_threads_working--;
    enc_row_mt->num_tile_cols_done[sb_row]++;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  if (do_pipelined_lpf_mt_with_enc) {
    // Loop-filter a superblock row if encoding of the current and next
    // superblock row is complete.
    // TODO(deepa.kg @ittiam.com) Evaluate encoder speed by interleaving
    // encoding and loop filter stage.
    launch_loop_filter_rows(cm, thread_data, enc_row_mt, mib_size_log2);
  }
  av1_free_pc_tree_recursive(thread_data->td->pc_root, av1_num_planes(cm), 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  thread_data->td->pc_root = NULL;
  error_info->setjmp = 0;
  return 1;
}